

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structure.cpp
# Opt level: O2

void __thiscall
polyscope::Structure::Structure(Structure *this,void **vtt,string *name_,string *subtypeName)

{
  string *__rhs;
  undefined8 uVar1;
  _func_int **pp_Var2;
  mat<4,_4,_float,_(glm::qualifier)0> value_;
  undefined1 auVar3 [40];
  undefined8 uVar5;
  undefined4 uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  PersistentValue<float> *local_b8;
  PersistentValue<bool> *local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  
  __rhs = &this->name;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec2.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec2.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec4.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec4.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec4.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uint32.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::allocator<polyscope::render::ManagedBuffer<unsigned_int>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uint32.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::allocator<polyscope::render::ManagedBuffer<unsigned_int>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uint32.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::allocator<polyscope::render::ManagedBuffer<unsigned_int>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_int32.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<int>_*,_std::allocator<polyscope::render::ManagedBuffer<int>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_int32.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<int>_*,_std::allocator<polyscope::render::ManagedBuffer<int>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_int32.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<int>_*,_std::allocator<polyscope::render::ManagedBuffer<int>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec2.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec2.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr2vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr2vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr3vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr3vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr3vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr4vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr4vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr4vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec2.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec4.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<4,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<4,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec4.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<4,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<4,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec4.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<4,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<4,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr2vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_float.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<float>_*,_std::allocator<polyscope::render::ManagedBuffer<float>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_float.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<float>_*,_std::allocator<polyscope::render::ManagedBuffer<float>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_float.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<float>_*,_std::allocator<polyscope::render::ManagedBuffer<float>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_double.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<double>_*,_std::allocator<polyscope::render::ManagedBuffer<double>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_double.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<double>_*,_std::allocator<polyscope::render::ManagedBuffer<double>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_double.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<double>_*,_std::allocator<polyscope::render::ManagedBuffer<double>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec2.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec2.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pp_Var2 = (_func_int **)*vtt;
  this->_vptr_Structure = pp_Var2;
  *(void **)((long)&this->_vptr_Structure + (long)pp_Var2[-3]) = vtt[1];
  std::__cxx11::string::string((string *)__rhs,(string *)name_);
  std::operator+(&local_d8,subtypeName,"#");
  std::operator+(&local_118,&local_d8,__rhs);
  std::operator+(&local_f8,&local_118,"#enabled");
  PersistentValue<bool>::PersistentValue(&this->enabled,&local_f8,true);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_d8);
  local_b0 = &this->enabled;
  std::operator+(&local_d8,subtypeName,"#");
  std::operator+(&local_118,&local_d8,__rhs);
  std::operator+(&local_f8,&local_118,"#object_transform");
  local_70 = 0x3f800000;
  uStack_6c = 0;
  uStack_68 = 0;
  uStack_64 = 0;
  uStack_60 = 0;
  uStack_5c = 0x3f800000;
  uStack_58 = 0;
  uStack_50 = 0;
  uStack_48 = 0x3f800000;
  uStack_44 = 0;
  uStack_40 = 0;
  uStack_3c = 0;
  uStack_38 = 0;
  uStack_34 = 0x3f800000;
  auVar3 = ZEXT2440(CONCAT816(0x3f80000000000000,ZEXT816(0x3f800000)));
  value_.value[2].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x3f800000;
  value_.value[2].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
  auVar6 = auVar3._0_16_;
  auVar4 = auVar3._16_16_;
  value_.value[0].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)auVar6._0_4_;
  value_.value[0].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)auVar6._4_4_;
  value_.value[0].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)auVar6._8_4_;
  value_.value[0].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)auVar6._12_4_;
  value_.value[1].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)auVar4._0_4_;
  value_.value[1].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)auVar4._4_4_;
  value_.value[1].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)auVar4._8_4_;
  value_.value[1].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)auVar4._12_4_;
  value_.value[2].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)auVar3._32_4_;
  value_.value[2].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)auVar3._36_4_;
  value_.value[3].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  value_.value[3].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  value_.value[3].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  value_.value[3].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x3f800000;
  PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::PersistentValue
            (&this->objectTransform,&local_f8,value_);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_d8);
  std::operator+(&local_d8,subtypeName,"#");
  std::operator+(&local_118,&local_d8,__rhs);
  std::operator+(&local_f8,&local_118,"#transparency");
  local_b8 = &this->transparency;
  PersistentValue<float>::PersistentValue(local_b8,&local_f8,1.0);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_d8);
  std::operator+(&local_118,subtypeName,"#");
  std::operator+(&local_f8,&local_118,__rhs);
  std::operator+(&local_90,&local_f8,"#transform_gizmo");
  TransformationGizmo::TransformationGizmo
            (&this->transformGizmo,&local_90,&(this->objectTransform).value,&this->objectTransform);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::operator+(&local_d8,subtypeName,"#");
  std::operator+(&local_118,&local_d8,__rhs);
  std::operator+(&local_f8,&local_118,"#cullWholeElements");
  PersistentValue<bool>::PersistentValue(&this->cullWholeElements,&local_f8,false);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_d8);
  std::operator+(&local_d8,subtypeName,"#");
  std::operator+(&local_118,&local_d8,__rhs);
  std::operator+(&local_f8,&local_118,"#ignored_slice_planes");
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  PersistentValue<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::PersistentValue(&this->ignoredSlicePlaneNames,&local_f8,&local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_d8);
  uVar7 = 0xc4424000;
  uVar5 = 0xc4424000c4424000;
  auVar6._8_4_ = uVar7;
  auVar6._0_8_ = uVar5;
  auVar6._12_4_ = 0xc4424000;
  (this->objectSpaceBoundingBox).
  super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  .super__Tuple_impl<1UL,_glm::vec<3,_float,_(glm::qualifier)0>_> =
       (_Tuple_impl<1UL,_glm::vec<3,_float,_(glm::qualifier)0>_>)auVar6._0_12_;
  (this->objectSpaceBoundingBox).
  super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  .super__Head_base<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0xc4424000;
  uVar1 = vmovlps_avx(auVar6);
  (this->objectSpaceBoundingBox).
  super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  .super__Head_base<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(int)uVar1;
  (this->objectSpaceBoundingBox).
  super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  .super__Head_base<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2 =
       (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)(int)((ulong)uVar1 >> 0x20);
  this->objectSpaceLengthScale = -777.0;
  validateName(__rhs);
  return;
}

Assistant:

Structure::Structure(std::string name_, std::string subtypeName)
    : name(name_), enabled(subtypeName + "#" + name + "#enabled", true),
      objectTransform(subtypeName + "#" + name + "#object_transform", glm::mat4(1.0)),
      transparency(subtypeName + "#" + name + "#transparency", 1.0),
      transformGizmo(subtypeName + "#" + name + "#transform_gizmo", objectTransform.get(), &objectTransform),
      cullWholeElements(subtypeName + "#" + name + "#cullWholeElements", false),
      ignoredSlicePlaneNames(subtypeName + "#" + name + "#ignored_slice_planes", {}),
      objectSpaceBoundingBox(
          std::tuple<glm::vec3, glm::vec3>{glm::vec3{-777, -777, -777}, glm::vec3{-777, -777, -777}}),
      objectSpaceLengthScale(-777) {
  validateName(name);
}